

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O2

int ARKStepResize(void *arkode_mem,N_Vector y0,realtype hscale,realtype t0,ARKVecResizeFn resize,
                 void *resize_data)

{
  int iVar1;
  SUNNonlinearSolver NLS;
  long lVar2;
  long lVar3;
  char *msgfmt;
  int liw_diff;
  int lrw_diff;
  sunindextype liw1;
  sunindextype lrw1;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  
  iVar1 = arkStep_AccessStepMem(arkode_mem,"ARKStepResize",&ark_mem,&step_mem);
  if (iVar1 != 0) {
    return iVar1;
  }
  liw1 = 0;
  lrw1 = 0;
  if (y0->ops->nvspace != (_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr *)0x0) {
    N_VSpace(y0,&lrw1,&liw1);
  }
  lrw_diff = lrw1 - ark_mem->lrw1;
  liw_diff = liw1 - ark_mem->liw1;
  ark_mem->lrw1 = lrw1;
  ark_mem->liw1 = liw1;
  iVar1 = arkResize(ark_mem,y0,hscale,t0,resize,resize_data);
  if (iVar1 != 0) {
    msgfmt = "Unable to resize main ARKode infrastructure";
    goto LAB_003a80d9;
  }
  iVar1 = arkResizeVec(ark_mem,resize,resize_data,lrw_diff,liw_diff,y0,&step_mem->sdata);
  if (((iVar1 == 0) ||
      (iVar1 = arkResizeVec(ark_mem,resize,resize_data,lrw_diff,liw_diff,y0,&step_mem->zpred),
      iVar1 == 0)) ||
     (iVar1 = arkResizeVec(ark_mem,resize,resize_data,lrw_diff,liw_diff,y0,&step_mem->zcor),
     iVar1 == 0)) {
LAB_003a80c1:
    msgfmt = "Unable to resize vector";
  }
  else {
    if (step_mem->Fe != (N_Vector *)0x0) {
      lVar3 = -1;
      lVar2 = 0;
      do {
        lVar3 = lVar3 + 1;
        if (step_mem->stages <= lVar3) goto LAB_003a807a;
        iVar1 = arkResizeVec(ark_mem,resize,resize_data,lrw_diff,liw_diff,y0,
                             (N_Vector *)(lVar2 + (long)step_mem->Fe));
        lVar2 = lVar2 + 8;
      } while (iVar1 != 0);
      goto LAB_003a80c1;
    }
LAB_003a807a:
    if (step_mem->Fi != (N_Vector *)0x0) {
      lVar3 = -1;
      lVar2 = 0;
      do {
        lVar3 = lVar3 + 1;
        if (step_mem->stages <= lVar3) goto LAB_003a80f6;
        iVar1 = arkResizeVec(ark_mem,resize,resize_data,lrw_diff,liw_diff,y0,
                             (N_Vector *)(lVar2 + (long)step_mem->Fi));
        lVar2 = lVar2 + 8;
      } while (iVar1 != 0);
      goto LAB_003a80c1;
    }
LAB_003a80f6:
    if (step_mem->NLS == (SUNNonlinearSolver)0x0) {
      return 0;
    }
    if (step_mem->ownNLS == 0) {
LAB_003a8192:
      step_mem->nsetups = 0;
      return 0;
    }
    iVar1 = SUNNonlinSolFree(step_mem->NLS);
    if (iVar1 != 0) {
      return iVar1;
    }
    step_mem->NLS = (SUNNonlinearSolver)0x0;
    step_mem->ownNLS = 0;
    NLS = SUNNonlinSol_Newton(y0,ark_mem->sunctx);
    if (NLS == (SUNNonlinearSolver)0x0) {
      msgfmt = "Error creating default Newton solver";
    }
    else {
      iVar1 = ARKStepSetNonlinearSolver(ark_mem,NLS);
      if (iVar1 == 0) {
        step_mem->ownNLS = 1;
        if (step_mem->NLS == (SUNNonlinearSolver)0x0) {
          return 0;
        }
        goto LAB_003a8192;
      }
      msgfmt = "Error attaching default Newton solver";
    }
  }
  iVar1 = -0x14;
LAB_003a80d9:
  arkProcessError(ark_mem,iVar1,"ARKode::ARKStep","ARKStepResize",msgfmt);
  return iVar1;
}

Assistant:

int ARKStepResize(void *arkode_mem, N_Vector y0, realtype hscale,
                  realtype t0, ARKVecResizeFn resize, void *resize_data)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  SUNNonlinearSolver NLS;
  sunindextype lrw1, liw1, lrw_diff, liw_diff;
  int i, retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "ARKStepResize",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* Determing change in vector sizes */
  lrw1 = liw1 = 0;
  if (y0->ops->nvspace != NULL)
    N_VSpace(y0, &lrw1, &liw1);
  lrw_diff = lrw1 - ark_mem->lrw1;
  liw_diff = liw1 - ark_mem->liw1;
  ark_mem->lrw1 = lrw1;
  ark_mem->liw1 = liw1;

  /* resize ARKode infrastructure memory */
  retval = arkResize(ark_mem, y0, hscale, t0, resize, resize_data);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, retval, "ARKode::ARKStep", "ARKStepResize",
                    "Unable to resize main ARKode infrastructure");
    return(retval);
  }

  /* Resize the sdata, zpred and zcor vectors */
  if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                    liw_diff, y0, &step_mem->sdata)) {
    arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::ARKStep", "ARKStepResize",
                    "Unable to resize vector");
    return(ARK_MEM_FAIL);
  }

  if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                    liw_diff, y0, &step_mem->zpred)) {
    arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::ARKStep", "ARKStepResize",
                    "Unable to resize vector");
    return(ARK_MEM_FAIL);
  }

  if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                    liw_diff, y0, &step_mem->zcor)) {
    arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::ARKStep", "ARKStepResize",
                    "Unable to resize vector");
    return(ARK_MEM_FAIL);
  }

  /* Resize the ARKStep vectors */
  /*     Fe */
  if (step_mem->Fe != NULL) {
    for (i=0; i<step_mem->stages; i++) {
      if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                        liw_diff, y0, &step_mem->Fe[i])) {
        arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::ARKStep", "ARKStepResize",
                        "Unable to resize vector");
        return(ARK_MEM_FAIL);
      }
    }
  }
  /*     Fi */
  if (step_mem->Fi != NULL) {
    for (i=0; i<step_mem->stages; i++) {
      if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                        liw_diff, y0, &step_mem->Fi[i])) {
        arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::ARKStep", "ARKStepResize",
                        "Unable to resize vector");
        return(ARK_MEM_FAIL);
      }
    }
  }

  /* If a NLS object was previously used, destroy and recreate default Newton
     NLS object (can be replaced by user-defined object if desired) */
  if ((step_mem->NLS != NULL) && (step_mem->ownNLS)) {

    /* destroy existing NLS object */
    retval = SUNNonlinSolFree(step_mem->NLS);
    if (retval != ARK_SUCCESS)  return(retval);
    step_mem->NLS = NULL;
    step_mem->ownNLS = SUNFALSE;

    /* create new Newton NLS object */
    NLS = SUNNonlinSol_Newton(y0, ark_mem->sunctx);
    if (NLS == NULL) {
      arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::ARKStep",
                      "ARKStepResize", "Error creating default Newton solver");
      return(ARK_MEM_FAIL);
    }

    /* attach new Newton NLS object to ARKStep */
    retval = ARKStepSetNonlinearSolver(ark_mem, NLS);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::ARKStep",
                      "ARKStepResize", "Error attaching default Newton solver");
      return(ARK_MEM_FAIL);
    }
    step_mem->ownNLS = SUNTRUE;

  }

  /* reset nonlinear solver counters */
  if (step_mem->NLS != NULL)  step_mem->nsetups = 0;

  return(ARK_SUCCESS);
}